

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O0

void transform_reduce<tf::DynamicPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  FlowBuilder *pFVar2;
  undefined1 *__stat_loc;
  double __x;
  double __x_00;
  double __x_01;
  Expression_lhs<const_int_&> EVar3;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  Task ptask;
  Task stask;
  iterator end;
  iterator beg;
  int pmin;
  int smin;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t n;
  vector<Data,_std::allocator<Data>_> vec;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffffa08;
  Result *pRVar4;
  undefined4 in_stack_fffffffffffffa10;
  Enum in_stack_fffffffffffffa14;
  Executor *in_stack_fffffffffffffa18;
  int line;
  undefined4 in_stack_fffffffffffffa20;
  Enum in_stack_fffffffffffffa24;
  int *in_stack_fffffffffffffa28;
  Enum at;
  undefined4 in_stack_fffffffffffffa30;
  Enum in_stack_fffffffffffffa34;
  Executor *in_stack_fffffffffffffa40;
  anon_class_40_5_697928ac *c_00;
  FlowBuilder *this;
  ExpressionDecomposer local_574;
  Executor *in_stack_fffffffffffffa90;
  Enum in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  undefined8 in_stack_fffffffffffffaf8;
  undefined8 in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  ExpressionDecomposer local_4ac;
  int *local_4a8;
  Enum local_4a0;
  ResultBuilder local_478;
  int local_3fc;
  int *local_3f8;
  Enum local_3f0;
  ExpressionDecomposer local_3e4;
  int *local_3e0;
  Enum local_3d8;
  ResultBuilder local_3b0;
  __basic_future<void> local_338 [2];
  undefined8 local_318;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_300;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_2f8;
  FlowBuilder local_2f0;
  undefined1 local_2e8 [64];
  atomic<unsigned_long> local_2a8;
  int local_2a0;
  undefined1 local_29c [12];
  pointer local_290;
  pointer local_288;
  int local_27c [5];
  initializer_list<int> local_268;
  undefined1 local_258 [24];
  vector<Data,_std::allocator<Data>_> local_240;
  anon_class_40_5_697928ac local_228 [5];
  undefined1 local_140 [320];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),in_stack_fffffffffffffa08
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffaf8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x18f3f6);
  tf::Taskflow::Taskflow((Taskflow *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  std::allocator<Data>::allocator((allocator<Data> *)0x18f417);
  std::vector<Data,_std::allocator<Data>_>::vector
            ((vector<Data,_std::allocator<Data>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
             (size_type)in_stack_fffffffffffffa28,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  std::allocator<Data>::~allocator((allocator<Data> *)0x18f43d);
  local_258._8_8_ = (FlowBuilder *)0x1;
  do {
    this = (FlowBuilder *)local_258._8_8_;
    pFVar2 = (FlowBuilder *)std::vector<Data,_std::allocator<Data>_>::size(&local_240);
    if (pFVar2 <= this) {
      std::vector<Data,_std::allocator<Data>_>::~vector
                ((vector<Data,_std::allocator<Data>_> *)
                 CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      tf::Executor::~Executor(in_stack_fffffffffffffa40);
      return;
    }
    local_27c[0] = 0;
    local_27c[1] = 1;
    local_27c[2] = 3;
    local_27c[3] = 7;
    local_27c[4] = 99;
    local_268._M_array = local_27c;
    local_268._M_len = 5;
    local_258._0_8_ = &local_268;
    local_288 = (pointer)std::initializer_list<int>::begin((initializer_list<int> *)local_258._0_8_)
    ;
    local_290 = (pointer)std::initializer_list<int>::end
                                   ((initializer_list<int> *)
                                    CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
    for (; at = (Enum)((ulong)in_stack_fffffffffffffa28 >> 0x20), local_288 != local_290;
        local_288 = (pointer)((long)&(local_288->next).super___atomic_base<unsigned_long>._M_i + 4))
    {
      local_29c._4_8_ = SEXT48((int)(local_288->next).super___atomic_base<unsigned_long>._M_i);
      local_29c._0_4_ = std::numeric_limits<int>::max();
      local_2a0 = std::numeric_limits<int>::max();
      local_2a8.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)
           std::vector<Data,_std::allocator<Data>_>::end
                     ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffa08);
      local_2e8._56_8_ =
           std::vector<Data,_std::allocator<Data>_>::end
                     ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffa08);
      c_00 = local_228;
      tf::Taskflow::clear((Taskflow *)0x18f574);
      local_2e8._8_8_ = &local_2a8;
      local_2e8._24_8_ = local_2e8 + 0x38;
      local_2e8._32_8_ = local_258 + 8;
      local_2e8._40_8_ = local_29c;
      local_2e8._16_8_ = &local_240;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:620:37),_nullptr>
                (this,c_00);
      tf::Task::Task((Task *)local_2e8);
      local_2f8 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffa08);
      local_300 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffa08);
      tf::DynamicPartitioner<tf::DefaultClosureWrapper>::DynamicPartitioner
                ((DynamicPartitioner<tf::DefaultClosureWrapper> *)
                 CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 (size_t)in_stack_fffffffffffffa08);
      tf::FlowBuilder::
      transform_reduce<std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:632:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:633:9),_tf::DynamicPartitioner<tf::DefaultClosureWrapper>,_nullptr>
                (&local_2f0,local_228,local_2f8,local_300,&local_2a0,local_318);
      in_stack_fffffffffffffa40 = (Executor *)local_2e8;
      tf::Task::operator=((Task *)in_stack_fffffffffffffa40,(Task *)&local_2f0);
      tf::Task::precede<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 (Task *)in_stack_fffffffffffffa08);
      __stat_loc = local_140;
      tf::Executor::run(in_stack_fffffffffffffa18,
                        (Taskflow *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      line = (int)((ulong)in_stack_fffffffffffffa18 >> 0x20);
      std::__basic_future<void>::wait(local_338,__stat_loc);
      tf::Future<void>::~Future
                ((Future<void> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      pRVar4 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),at,
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),line,
                 (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),"",
                 (char *)in_stack_fffffffffffffa40);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3e4,DT_REQUIRE);
      EVar3 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),(int *)pRVar4
                        );
      local_3f8 = EVar3.lhs;
      in_stack_fffffffffffffa34 = EVar3.m_at;
      local_3f0 = in_stack_fffffffffffffa34;
      local_3e0 = local_3f8;
      local_3d8 = in_stack_fffffffffffffa34;
      local_3fc = std::numeric_limits<int>::max();
      doctest::detail::Expression_lhs<int_const&>::operator!=
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                 (int *)in_stack_fffffffffffffa90);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 pRVar4);
      doctest::detail::Result::~Result((Result *)0x18f7b8);
      doctest::detail::ResultBuilder::log(&local_3b0,__x);
      in_stack_fffffffffffffa30 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffa30);
      if ((extraout_AL & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x18f932);
      pRVar4 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),at,
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),line,
                 (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),"",
                 (char *)in_stack_fffffffffffffa40);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4ac,DT_REQUIRE);
      EVar3 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),(int *)pRVar4
                        );
      in_stack_fffffffffffffa28 = EVar3.lhs;
      in_stack_fffffffffffffa24 = EVar3.m_at;
      local_4a8 = in_stack_fffffffffffffa28;
      local_4a0 = in_stack_fffffffffffffa24;
      std::numeric_limits<int>::max();
      doctest::detail::Expression_lhs<int_const&>::operator!=
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                 (int *)in_stack_fffffffffffffa90);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 pRVar4);
      doctest::detail::Result::~Result((Result *)0x18fa23);
      doctest::detail::ResultBuilder::log(&local_478,__x_00);
      in_stack_fffffffffffffa20 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffffa20);
      if ((extraout_AL_00 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x18fb08);
      in_stack_fffffffffffffa08 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 (Enum)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),line,
                 (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),"",
                 (char *)in_stack_fffffffffffffa40);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_574,DT_REQUIRE);
      EVar3 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                         (int *)in_stack_fffffffffffffa08);
      in_stack_fffffffffffffa18 = (Executor *)EVar3.lhs;
      in_stack_fffffffffffffa14 = EVar3.m_at;
      in_stack_fffffffffffffa90 = in_stack_fffffffffffffa18;
      in_stack_fffffffffffffa98 = in_stack_fffffffffffffa14;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa14),
                 (int *)in_stack_fffffffffffffa18);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08);
      doctest::detail::Result::~Result((Result *)0x18fbe1);
      doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffac0,__x_01);
      in_stack_fffffffffffffa10 = CONCAT13(extraout_AL_01,(int3)in_stack_fffffffffffffa10);
      if ((extraout_AL_01 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x18fcc0);
    }
    local_258._8_8_ = local_258._8_8_ + 1;
  } while( true );
}

Assistant:

void transform_reduce(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<Data> vec(1000);

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      int smin = std::numeric_limits<int>::max();
      int pmin = std::numeric_limits<int>::max();
      auto beg = vec.end();
      auto end = vec.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg = vec.begin();
        end = vec.begin() + n;
        for(auto itr = beg; itr != end; itr++) {
          smin = std::min(itr->get(), smin);
        }
      });

      tf::Task ptask;

      ptask = taskflow.transform_reduce(
        std::ref(beg), std::ref(end), pmin,
        [] (int l, int r)   { return std::min(l, r); },
        [] (const Data& data) { return data.get(); },
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(smin != std::numeric_limits<int>::max());
      REQUIRE(pmin != std::numeric_limits<int>::max());
      REQUIRE(smin == pmin);
    }
  }
}